

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall chrono::fea::ChElementShellANCF_3423::Layer::SetupInitial(Layer *this)

{
  ChElementShellANCF_3423 *pCVar1;
  undefined1 auVar2 [32];
  bool bVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 extraout_var [56];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar57;
  double dVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  double dVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  ulong local_178;
  double local_118;
  double local_108;
  double local_f8;
  undefined1 auVar35 [32];
  undefined1 auVar72 [32];
  
  pCVar1 = this->m_element;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = pCVar1->m_lenY;
  auVar37._8_8_ = pCVar1->m_lenX;
  auVar37._0_8_ = pCVar1->m_lenX;
  auVar5 = vdivpd_avx512vl(_DAT_009aa830,auVar37);
  auVar37 = *(undefined1 (*) [16])
             ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 9);
  auVar17 = *(undefined1 (*) [16])
             ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0xc);
  dVar32 = (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[5];
  dVar27 = (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0xb];
  dVar80 = (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0xe];
  dVar26 = (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x11];
  dVar28 = (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x14];
  dVar49 = (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x17];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = pCVar1->m_thickness * 0.0 * 0.5;
  auVar18 = vunpcklpd_avx(auVar42,auVar18);
  auVar62 = vpermpd_avx2(ZEXT1632(auVar18),0x40);
  auVar22 = vpermpd_avx2(ZEXT1632(auVar5),0x50);
  auVar2 = vdivpd_avx(_DAT_009aa6c0,auVar62);
  auVar33._8_8_ = 0x3fd0000000000000;
  auVar33._0_8_ = 0x3fd0000000000000;
  auVar35._16_8_ = 0x3fd0000000000000;
  auVar35._0_16_ = auVar33;
  auVar35._24_8_ = 0x3fd0000000000000;
  auVar48._0_8_ = auVar62._0_8_ * 0.25;
  auVar48._8_8_ = auVar62._8_8_ * 0.25;
  auVar48._16_8_ = auVar62._16_8_ * 0.25;
  auVar48._24_8_ = auVar62._24_8_ * 0.25;
  auVar2 = vblendpd_avx(auVar2,auVar48,8);
  auVar62 = vpermpd_avx2(auVar48,0xee);
  auVar62 = vunpckhpd_avx(auVar35,auVar62);
  auVar22 = vmulpd_avx512vl(auVar22,auVar62);
  auVar62 = vpermpd_avx2(auVar2,0xac);
  auVar18 = *(undefined1 (*) [16])
             ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 3);
  auVar62 = vunpckhpd_avx(auVar35,auVar62);
  auVar69._0_8_ = auVar2._0_8_ * auVar62._0_8_;
  auVar69._8_8_ = auVar2._8_8_ * auVar62._8_8_;
  auVar72._16_8_ = auVar2._16_8_ * auVar62._16_8_;
  auVar72._0_16_ = auVar69;
  auVar72._24_8_ = auVar2._24_8_ * auVar62._24_8_;
  auVar5 = *(undefined1 (*) [16])
            (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
            m_data.array;
  auVar20 = auVar22._0_16_;
  auVar6 = vmovddup_avx512vl(auVar20);
  auVar19 = *(undefined1 (*) [16])
             ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 6);
  auVar7 = vshufpd_avx512vl(auVar20,auVar20,3);
  auVar8 = vextractf32x4_avx512vl(auVar22,1);
  auVar9 = vshufpd_avx512vl(auVar20,auVar20,1);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar28;
  auVar10 = vmulsd_avx512f(auVar20,auVar86);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar32;
  auVar11 = vmulsd_avx512f(auVar9,auVar94);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar49;
  auVar9 = vmulsd_avx512f(auVar9,auVar84);
  auVar12 = vmovddup_avx512vl(auVar8);
  auVar13 = vshufpd_avx512vl(auVar8,auVar8,3);
  auVar14 = vshufpd_avx512vl(auVar8,auVar8,1);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar27;
  auVar15 = vmulsd_avx512f(auVar14,auVar92);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar26;
  auVar14 = vmulsd_avx512f(auVar14,auVar88);
  auVar16 = vaddsd_avx512f(auVar10,auVar9);
  auVar76._0_8_ = auVar6._0_8_ * auVar5._0_8_;
  auVar76._8_8_ = auVar6._8_8_ * auVar5._8_8_;
  auVar9 = vfmadd231pd_fma(auVar76,auVar7,auVar18);
  auVar9 = vfmadd231pd_fma(auVar9,auVar12,auVar19);
  auVar9 = vfmadd231pd_fma(auVar9,auVar13,auVar37);
  auVar10 = vfmadd231pd_fma(auVar9,auVar17,auVar12);
  auVar9 = *(undefined1 (*) [16])
            ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array + 0xf);
  auVar12 = vfmadd231pd_fma(auVar10,auVar9,auVar13);
  auVar10 = *(undefined1 (*) [16])
             ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0x12);
  auVar6 = vfmadd231pd_fma(auVar12,auVar10,auVar6);
  auVar12 = *(undefined1 (*) [16])
             ((pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0x15);
  auVar6 = vfmadd231pd_fma(auVar6,auVar12,auVar7);
  dVar53 = (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[2];
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar53;
  auVar7 = vmulsd_avx512f(auVar20,auVar73);
  dVar57 = (pCVar1->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[8];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar57;
  auVar13 = vmulsd_avx512f(auVar8,auVar81);
  auVar13 = vaddsd_avx512f(auVar13,auVar15);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = auVar7._0_8_ + auVar11._0_8_;
  auVar7 = vaddsd_avx512f(auVar82,auVar13);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar80;
  auVar8 = vmulsd_avx512f(auVar8,auVar90);
  auVar8 = vaddsd_avx512f(auVar8,auVar14);
  auVar8 = vaddsd_avx512f(auVar8,auVar16);
  auVar11 = vshufpd_avx512vl(auVar69,auVar69,3);
  auVar7 = vaddsd_avx512f(auVar7,auVar8);
  auVar8 = vmovddup_avx512vl(auVar69);
  auVar13 = vmulpd_avx512vl(auVar5,auVar8);
  auVar13 = vfmadd231pd_avx512vl(auVar13,auVar11,auVar18);
  auVar8 = vfmadd231pd_avx512vl(auVar13,auVar19,auVar8);
  auVar13 = vextractf32x4_avx512vl(auVar72,1);
  auVar14 = vshufpd_avx512vl(auVar13,auVar13,3);
  auVar8 = vfmadd231pd_avx512vl(auVar8,auVar37,auVar11);
  auVar11 = vmovddup_avx512vl(auVar13);
  auVar8 = vfmadd231pd_avx512vl(auVar8,auVar11,auVar17);
  auVar8 = vfmadd231pd_avx512vl(auVar8,auVar14,auVar9);
  auVar8 = vfmadd231pd_avx512vl(auVar8,auVar10,auVar11);
  auVar11 = vmulsd_avx512f(auVar73,auVar69);
  auVar8 = vfmadd231pd_avx512vl(auVar8,auVar12,auVar14);
  auVar14 = vshufpd_avx512vl(auVar69,auVar69,1);
  auVar15 = vmulsd_avx512f(auVar94,auVar14);
  auVar14 = vmulsd_avx512f(auVar92,auVar14);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar57 * auVar69._0_8_;
  auVar14 = vaddsd_avx512f(auVar70,auVar14);
  auVar11 = vaddsd_avx512f(auVar11,auVar15);
  auVar15 = vshufpd_avx512vl(auVar13,auVar13,1);
  auVar16 = vmulsd_avx512f(auVar88,auVar15);
  auVar15 = vmulsd_avx512f(auVar15,auVar84);
  auVar11 = vaddsd_avx512f(auVar11,auVar14);
  auVar14 = vmulsd_avx512f(auVar90,auVar13);
  auVar13 = vmulsd_avx512f(auVar86,auVar13);
  auVar14 = vaddsd_avx512f(auVar14,auVar16);
  auVar13 = vaddsd_avx512f(auVar15,auVar13);
  auVar13 = vaddsd_avx512f(auVar14,auVar13);
  auVar11 = vaddsd_avx512f(auVar11,auVar13);
  auVar13 = ZEXT816(0) << 0x40;
  auVar36._0_8_ = auVar5._0_8_ * 0.0;
  auVar36._8_8_ = auVar5._8_8_ * 0.0;
  vmovsd_avx512f(auVar11);
  auVar18 = vfmadd231pd_fma(auVar36,auVar33,auVar18);
  auVar18 = vfmadd231pd_fma(auVar18,auVar13,auVar19);
  auVar37 = vfmadd231pd_fma(auVar18,auVar33,auVar37);
  auVar37 = vfmadd231pd_fma(auVar37,auVar13,auVar17);
  auVar37 = vfmadd231pd_fma(auVar37,auVar33,auVar9);
  auVar37 = vfmadd231pd_fma(auVar37,auVar10,auVar13);
  auVar5 = vfmadd231pd_fma(auVar37,auVar12,auVar33);
  auVar37 = ZEXT816(0x3fd0000000000000);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar32;
  auVar17 = vmulsd_avx512f(auVar95,auVar37);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar27;
  auVar18 = vmulsd_avx512f(auVar93,auVar37);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar26;
  auVar19 = vmulsd_avx512f(auVar89,auVar37);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar49;
  auVar9 = vmulsd_avx512f(auVar85,auVar37);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar80;
  auVar10 = vmulsd_avx512f(auVar91,ZEXT816(0) << 0x40);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar28;
  auVar12 = vmulsd_avx512f(auVar87,ZEXT816(0) << 0x40);
  auVar37 = vshufpd_avx(auVar5,auVar5,1);
  auVar13 = vmulsd_avx512f(auVar11,auVar37);
  dVar32 = dVar53 * 0.0 + auVar17._0_8_ + dVar57 * 0.0 + auVar18._0_8_ +
           auVar10._0_8_ + auVar19._0_8_ + auVar9._0_8_ + auVar12._0_8_;
  auVar18 = vshufpd_avx512vl(auVar8,auVar8,1);
  auVar17 = vmulsd_avx512f(auVar6,auVar18);
  auVar19 = vmulsd_avx512f(auVar8,auVar37);
  auVar14 = vshufpd_avx512vl(auVar6,auVar6,1);
  auVar9 = vmulsd_avx512f(auVar14,auVar8);
  auVar19 = vmulsd_avx512f(auVar7,auVar19);
  auVar15 = vfmsub231sd_avx512f(auVar9,auVar6,auVar18);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar32;
  auVar17 = vfmadd231sd_fma(auVar19,auVar50,auVar17);
  dVar80 = auVar14._0_8_;
  dVar53 = auVar5._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar80 * dVar53;
  auVar19 = vfmadd213sd_avx512f(auVar10,auVar11,auVar17);
  auVar17._8_8_ = 0x8000000000000000;
  auVar17._0_8_ = 0x8000000000000000;
  auVar17 = vxorpd_avx512vl(auVar7,auVar17);
  dVar57 = auVar18._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar57 * auVar17._0_8_;
  auVar17 = vfmadd231sd_fma(auVar19,auVar34,auVar5);
  auVar19 = vfmadd231sd_avx512f(auVar34,auVar14,auVar11);
  auVar17 = vfnmadd231sd_avx512f(auVar17,auVar13,auVar6);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar32 * dVar80;
  auVar17 = vfnmadd231sd_avx512f(auVar17,auVar43,auVar8);
  this->m_detJ0C = auVar17._0_8_;
  auVar17 = vmulsd_avx512f(auVar11,auVar6);
  auVar11 = vfmsub231sd_avx512f(auVar17,auVar7,auVar8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar80 * dVar80;
  auVar17 = vfmadd231sd_avx512f(auVar12,auVar6,auVar6);
  auVar17 = vfmadd231sd_avx512f(auVar17,auVar7,auVar7);
  auVar17 = vsqrtsd_avx(auVar17,auVar17);
  auVar29._0_8_ = 1.0 / auVar17._0_8_;
  auVar29._8_8_ = 0;
  dVar80 = dVar80 * auVar29._0_8_;
  auVar9 = vmulsd_avx512f(auVar6,auVar29);
  auVar12 = vmulsd_avx512f(auVar7,auVar29);
  dVar27 = auVar11._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar27 * dVar27;
  auVar17 = vfmadd231sd_fma(auVar30,auVar19,auVar19);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar80;
  auVar17 = vfmadd231sd_fma(auVar17,auVar15,auVar15);
  auVar17 = vsqrtsd_avx(auVar17,auVar17);
  dVar26 = 1.0 / auVar17._0_8_;
  bVar3 = 2.2250738585072014e-308 <= auVar17._0_8_;
  auVar16._0_8_ =
       (double)((ulong)bVar3 * (long)(auVar19._0_8_ * dVar26) + (ulong)!bVar3 * 0x3ff0000000000000);
  auVar16._8_8_ = 0;
  dVar27 = (double)((ulong)bVar3 * (long)(dVar27 * dVar26));
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar27;
  dVar26 = (double)((ulong)bVar3 * (long)(auVar15._0_8_ * dVar26));
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar26;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar80 * dVar26;
  auVar10 = vfmsub231sd_fma(auVar38,auVar20,auVar12);
  dVar49 = auVar12._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar49 * auVar16._0_8_;
  auVar12 = vfmsub231sd_fma(auVar39,auVar21,auVar9);
  dVar58 = auVar9._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar58 * dVar27;
  auVar9 = vfmsub231sd_fma(auVar31,auVar16,auVar54);
  dVar27 = cos(this->m_theta);
  dVar26 = sin(this->m_theta);
  dVar28 = sin(this->m_theta);
  auVar23._0_8_ = cos(this->m_theta);
  auVar23._8_56_ = extraout_var;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar32;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_178;
  auVar17 = vfmsub231sd_fma(auVar13,auVar18,auVar40);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar32 * auVar8._0_8_;
  auVar18 = vfmsub231sd_fma(auVar13,auVar71,auVar5);
  auVar17 = vunpcklpd_avx(auVar17,auVar18);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar57 * dVar53;
  auVar18 = vfmsub231sd_fma(auVar41,auVar37,auVar8);
  auVar19 = vfmsub231sd_fma(auVar43,auVar37,auVar7);
  auVar18 = vunpcklpd_avx(auVar18,auVar19);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar53 * auVar7._0_8_;
  auVar19 = vfmsub231sd_fma(auVar44,auVar6,auVar40);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = auVar37._0_8_ * auVar6._0_8_;
  auVar37 = vfmsub231sd_fma(auVar51,auVar14,auVar5);
  dVar32 = this->m_detJ0C;
  auVar59._8_8_ = dVar32;
  auVar59._0_8_ = dVar32;
  auVar5 = vunpcklpd_avx(auVar19,auVar37);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = auVar7._0_8_ * dVar57;
  auVar37 = vfmsub231sd_fma(auVar52,auVar14,auVar71);
  auVar19 = vunpcklpd_avx(auVar37,auVar11);
  local_118 = auVar9._0_8_;
  auVar9._8_8_ = extraout_XMM0_Qb;
  auVar9._0_8_ = dVar27;
  auVar37 = vdivpd_avx(auVar17,auVar59);
  auVar17 = vdivpd_avx(auVar18,auVar59);
  auVar18 = vdivpd_avx(auVar5,auVar59);
  auVar5._8_8_ = extraout_XMM0_Qb_01;
  auVar5._0_8_ = dVar28;
  auVar9 = vunpcklpd_avx(auVar9,auVar5);
  auVar5 = vdivpd_avx(auVar19,auVar59);
  auVar45._0_8_ = auVar15._0_8_ / dVar32;
  auVar45._8_8_ = 0;
  auVar19._8_8_ = extraout_XMM0_Qb_00;
  auVar19._0_8_ = dVar26;
  local_108 = auVar10._0_8_;
  auVar19 = vunpcklpd_avx(auVar19,auVar23._0_16_);
  local_f8 = auVar12._0_8_;
  dVar32 = auVar19._0_8_;
  auVar7._0_8_ = local_108 * dVar32;
  dVar27 = auVar19._8_8_;
  auVar7._8_8_ = local_108 * dVar27;
  auVar19 = vshufpd_avx(auVar5,auVar5,1);
  auVar60._0_8_ = local_f8 * dVar32;
  auVar60._8_8_ = local_f8 * dVar27;
  auVar6._0_8_ = local_118 * dVar32;
  auVar6._8_8_ = local_118 * dVar27;
  dVar32 = auVar9._0_8_;
  auVar64._0_8_ = dVar58 * dVar32;
  dVar27 = auVar9._8_8_;
  auVar64._8_8_ = dVar58 * dVar27;
  auVar74._0_8_ = auVar64._0_8_ + auVar7._0_8_;
  auVar9 = vsubpd_avx(auVar7,auVar64);
  auVar11._8_8_ = auVar9._8_8_;
  auVar11._0_8_ = auVar74._0_8_;
  auVar9 = vshufpd_avx(auVar9,auVar9,3);
  auVar74._8_8_ = auVar74._0_8_;
  auVar65._0_8_ = dVar80 * dVar32;
  auVar65._8_8_ = dVar80 * dVar27;
  dVar80 = auVar65._0_8_ + auVar60._0_8_;
  auVar10 = vsubpd_avx(auVar60,auVar65);
  auVar66._0_8_ = dVar49 * dVar32;
  auVar66._8_8_ = dVar49 * dVar27;
  dVar27 = auVar66._0_8_ + auVar6._0_8_;
  auVar12 = vsubpd_avx(auVar6,auVar66);
  auVar6 = vunpckhpd_avx(auVar5,auVar37);
  auVar61._0_8_ = auVar6._0_8_ * dVar80;
  auVar61._8_8_ = auVar6._8_8_ * auVar10._8_8_;
  auVar6 = vunpcklpd_avx(auVar5,auVar37);
  auVar8._8_8_ = auVar12._8_8_;
  auVar8._0_8_ = dVar27;
  auVar7 = vfmadd213pd_fma(auVar6,auVar11,auVar61);
  auVar6 = vunpcklpd_avx(auVar45,auVar17);
  auVar6 = vfmadd213pd_fma(auVar6,auVar8,auVar7);
  auVar19 = vmulsd_avx512f(auVar20,auVar19);
  auVar7 = vfmadd231sd_avx512f(auVar19,auVar5,auVar16);
  auVar11 = vaddsd_avx512f(auVar6,auVar6);
  auVar19 = vshufpd_avx(auVar6,auVar6,1);
  dVar32 = auVar6._0_8_;
  dVar26 = auVar19._0_8_;
  auVar13 = vfmadd231sd_avx512f(auVar7,auVar45,auVar21);
  auVar7 = vmulsd_avx512f(auVar13,auVar11);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1b] = auVar7._0_8_;
  auVar10 = vshufpd_avx(auVar10,auVar10,3);
  auVar55._0_8_ = auVar18._0_8_ * auVar10._0_8_;
  auVar55._8_8_ = auVar5._8_8_ * auVar10._8_8_;
  auVar5 = vshufpd_avx(auVar17,auVar5,1);
  auVar10 = vshufpd_avx(auVar18,auVar45,1);
  auVar23 = vbroadcasti64x4_avx512f(_DAT_009986a0);
  auVar9 = vfmadd213pd_fma(auVar5,auVar9,auVar55);
  auVar5 = vshufpd_avx(auVar37,auVar18,1);
  auVar68._0_8_ = auVar37._0_8_;
  auVar68._8_8_ = auVar17._8_8_;
  auVar63._8_8_ = auVar18._8_8_;
  auVar63._0_8_ = auVar17._0_8_;
  auVar37 = vshufpd_avx(auVar12,auVar12,3);
  auVar46._0_8_ = auVar5._0_8_ * dVar80;
  auVar46._8_8_ = auVar5._8_8_ * dVar80;
  auVar17 = vfmadd213pd_fma(auVar74,auVar68,auVar46);
  auVar47._8_8_ = dVar27;
  auVar47._0_8_ = dVar27;
  auVar9 = vfmadd213pd_fma(auVar10,auVar37,auVar9);
  auVar10 = vfmadd213pd_fma(auVar47,auVar63,auVar17);
  auVar37 = vshufpd_avx(auVar6,auVar9,1);
  auVar2 = vpermpd_avx2(ZEXT1632(auVar9),0x54);
  dVar27 = auVar10._0_8_ + auVar10._0_8_;
  dVar80 = auVar10._8_8_ + auVar10._8_8_;
  auVar17 = vshufpd_avx(auVar10,auVar10,1);
  auVar24 = vpermi2pd_avx512f(auVar23,ZEXT1664(auVar10),ZEXT1664(auVar6));
  dVar49 = auVar37._0_8_;
  dVar53 = auVar37._8_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = auVar17._0_8_ * dVar26;
  auVar7 = vfmadd231sd_fma(auVar75,auVar10,auVar9);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xc] = dVar49 * dVar27;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xd] = dVar53 * dVar80;
  auVar18 = vmovddup_avx512vl(auVar20);
  auVar77._0_8_ = auVar18._0_8_ * auVar5._0_8_;
  auVar77._8_8_ = auVar18._8_8_ * auVar5._8_8_;
  auVar18 = vmovddup_avx512vl(auVar16);
  auVar18 = vfmadd213pd_fma(auVar18,auVar68,auVar77);
  auVar5 = vmovddup_avx512vl(auVar21);
  auVar12 = vfmadd213pd_fma(auVar5,auVar63,auVar18);
  dVar28 = auVar12._0_8_;
  auVar18 = vshufpd_avx(auVar12,auVar12,1);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar28 * auVar17._0_8_;
  auVar5 = vfmadd231sd_fma(auVar83,auVar10,auVar18);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar26 * auVar18._0_8_;
  auVar8 = vfmadd231sd_fma(auVar78,auVar12,auVar9);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1a] = auVar5._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1e] = dVar28 * (dVar49 + dVar49);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x1f] = auVar12._8_8_ * (dVar53 + dVar53);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xe] = auVar7._0_8_;
  auVar5 = vshufpd_avx(auVar9,auVar9,1);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x20] = auVar8._0_8_;
  auVar23 = _DAT_009aa880;
  auVar8 = vmulsd_avx512f(auVar5,auVar11);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar32 * dVar26;
  auVar7 = vfmadd231sd_fma(auVar67,auVar10,auVar5);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xf] = auVar8._0_8_;
  dVar26 = auVar5._0_8_;
  auVar25 = vpermi2pd_avx512f(auVar23,auVar24,ZEXT1664(auVar9));
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x21] = (dVar26 + dVar26) * auVar13._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x10] = auVar7._0_8_;
  auVar23 = _DAT_009aa8c0;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar28 * dVar26;
  auVar19 = vfmadd231sd_fma(auVar79,auVar13,auVar19);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x22] = auVar19._0_8_;
  auVar4 = _DAT_009aa980;
  auVar24 = _DAT_009aa940;
  auVar23 = vpermpd_avx512f(auVar23,auVar25);
  auVar25 = vpermpd_avx512f(_DAT_009aa900,auVar25);
  auVar23 = vmulpd_avx512f(auVar23,auVar25);
  *(undefined1 (*) [64])
   (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
       = auVar23;
  auVar19 = vunpckhpd_avx(auVar6,auVar9);
  auVar62._16_16_ = auVar37;
  auVar62._0_16_ = auVar19;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [8] = auVar19._0_8_ * auVar2._0_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [9] = auVar19._8_8_ * auVar2._8_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [10] = dVar49 * auVar2._16_8_;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0xb] = dVar53 * auVar2._24_8_;
  auVar14._0_8_ = dVar28 * dVar32;
  auVar14._8_8_ = auVar12._8_8_ * dVar32;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar9._0_8_ * dVar32;
  auVar37 = vfmadd231sd_fma(auVar56,auVar5,auVar17);
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x11] = auVar37._0_8_;
  auVar23 = vbroadcastsd_avx512f(auVar13);
  auVar25 = vblendmpd_avx512f(ZEXT1664(auVar12),auVar23);
  auVar25 = ZEXT3264(CONCAT824(auVar25._24_8_,auVar62._0_24_));
  auVar37 = vfmadd213pd_fma(auVar23._0_16_,auVar10,auVar14);
  auVar23 = vpermpd_avx512f(auVar24,auVar25);
  auVar24 = vpermi2pd_avx512f(auVar4,auVar25,ZEXT1664(CONCAT88(dVar80,dVar27)));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar26 * auVar18._0_8_;
  auVar17 = vfmadd231sd_fma(auVar15,auVar13,auVar9);
  auVar23 = vmulpd_avx512f(auVar23,auVar24);
  *(undefined1 (*) [64])
   ((this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0x12) = auVar23;
  *(undefined1 (*) [16])
   ((this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
   + 0x1c) = auVar37;
  (this->m_T0).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
  [0x23] = auVar17._0_8_;
  return;
}

Assistant:

void ChElementShellANCF_3423::Layer::SetupInitial() {
    // Evaluate shape functions at element center
    ChMatrixNM<double, 1, 8> Nx;
    ChMatrixNM<double, 1, 8> Ny;
    ChMatrixNM<double, 1, 8> Nz;
    m_element->ShapeFunctionsDerivativeX(Nx, 0, 0, 0);
    m_element->ShapeFunctionsDerivativeY(Ny, 0, 0, 0);
    m_element->ShapeFunctionsDerivativeZ(Nz, 0, 0, 0);

    ChMatrixNM<double, 1, 3> Nx_d0 = Nx * m_element->m_d0;
    ChMatrixNM<double, 1, 3> Ny_d0 = Ny * m_element->m_d0;
    ChMatrixNM<double, 1, 3> Nz_d0 = Nz * m_element->m_d0;

    // Determinant of position vector gradient matrix: Initial configuration
    m_detJ0C = Nx_d0(0, 0) * Ny_d0(0, 1) * Nz_d0(0, 2) + Ny_d0(0, 0) * Nz_d0(0, 1) * Nx_d0(0, 2) +
               Nz_d0(0, 0) * Nx_d0(0, 1) * Ny_d0(0, 2) - Nx_d0(0, 2) * Ny_d0(0, 1) * Nz_d0(0, 0) -
               Ny_d0(0, 2) * Nz_d0(0, 1) * Nx_d0(0, 0) - Nz_d0(0, 2) * Nx_d0(0, 1) * Ny_d0(0, 0);

    //// Transformation : Orthogonal transformation (A and J) ////
    ChVector<double> G1xG2;  // Cross product of first and second column of
    double G1dotG1;          // Dot product of first column of position vector gradient

    G1xG2.x() = Nx_d0(1) * Ny_d0(2) - Nx_d0(2) * Ny_d0(1);
    G1xG2.y() = Nx_d0(2) * Ny_d0(0) - Nx_d0(0) * Ny_d0(2);
    G1xG2.z() = Nx_d0(0) * Ny_d0(1) - Nx_d0(1) * Ny_d0(0);
    G1dotG1 = Nx_d0(0) * Nx_d0(0) + Nx_d0(1) * Nx_d0(1) + Nx_d0(2) * Nx_d0(2);

    // Tangent Frame
    ChVector<double> A1;
    ChVector<double> A2;
    ChVector<double> A3;
    A1.x() = Nx_d0(0);
    A1.y() = Nx_d0(1);
    A1.z() = Nx_d0(2);
    A1 = A1 / sqrt(G1dotG1);
    A3 = G1xG2.GetNormalized();
    A2.Cross(A3, A1);

    ChVector<double> AA1;
    ChVector<double> AA2;
    ChVector<double> AA3;
    AA1 = A1 * cos(m_theta) + A2 * sin(m_theta);
    AA2 = -A1 * sin(m_theta) + A2 * cos(m_theta);
    AA3 = A3;

    ////Beta
    ChMatrixNM<double, 3, 3> j0;
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    ChVectorN<double, 9> beta;

    j0(0, 0) = Ny_d0(1) * Nz_d0(2) - Nz_d0(1) * Ny_d0(2);
    j0(0, 1) = Ny_d0(2) * Nz_d0(0) - Ny_d0(0) * Nz_d0(2);
    j0(0, 2) = Ny_d0(0) * Nz_d0(1) - Nz_d0(0) * Ny_d0(1);
    j0(1, 0) = Nz_d0(1) * Nx_d0(2) - Nx_d0(1) * Nz_d0(2);
    j0(1, 1) = Nz_d0(2) * Nx_d0(0) - Nx_d0(2) * Nz_d0(0);
    j0(1, 2) = Nz_d0(0) * Nx_d0(1) - Nz_d0(1) * Nx_d0(0);
    j0(2, 0) = Nx_d0(1) * Ny_d0(2) - Ny_d0(1) * Nx_d0(2);
    j0(2, 1) = Ny_d0(0) * Nx_d0(2) - Nx_d0(0) * Ny_d0(2);
    j0(2, 2) = Nx_d0(0) * Ny_d0(1) - Ny_d0(0) * Nx_d0(1);
    j0 /= m_detJ0C;

    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);

    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    // Calculate T0: transformation matrix, function of fiber angle (see Yamashita et al, 2015, JCND)
    m_T0(0, 0) = pow(beta(0), 2);
    m_T0(1, 0) = pow(beta(1), 2);
    m_T0(2, 0) = 2.0 * beta(0) * beta(1);
    m_T0(3, 0) = pow(beta(2), 2);
    m_T0(4, 0) = 2.0 * beta(0) * beta(2);
    m_T0(5, 0) = 2.0 * beta(1) * beta(2);

    m_T0(0, 1) = pow(beta(3), 2);
    m_T0(1, 1) = pow(beta(4), 2);
    m_T0(2, 1) = 2.0 * beta(3) * beta(4);
    m_T0(3, 1) = pow(beta(5), 2);
    m_T0(4, 1) = 2.0 * beta(3) * beta(5);
    m_T0(5, 1) = 2.0 * beta(4) * beta(5);

    m_T0(0, 2) = beta(0) * beta(3);
    m_T0(1, 2) = beta(1) * beta(4);
    m_T0(2, 2) = beta(0) * beta(4) + beta(1) * beta(3);
    m_T0(3, 2) = beta(2) * beta(5);
    m_T0(4, 2) = beta(0) * beta(5) + beta(2) * beta(3);
    m_T0(5, 2) = beta(2) * beta(4) + beta(1) * beta(5);

    m_T0(0, 3) = pow(beta(6), 2);
    m_T0(1, 3) = pow(beta(7), 2);
    m_T0(2, 3) = 2.0 * beta(6) * beta(7);
    m_T0(3, 3) = pow(beta(8), 2);
    m_T0(4, 3) = 2.0 * beta(6) * beta(8);
    m_T0(5, 3) = 2.0 * beta(7) * beta(8);

    m_T0(0, 4) = beta(0) * beta(6);
    m_T0(1, 4) = beta(1) * beta(7);
    m_T0(2, 4) = beta(0) * beta(7) + beta(6) * beta(1);
    m_T0(3, 4) = beta(2) * beta(8);
    m_T0(4, 4) = beta(0) * beta(8) + beta(2) * beta(6);
    m_T0(5, 4) = beta(1) * beta(8) + beta(2) * beta(7);

    m_T0(0, 5) = beta(3) * beta(6);
    m_T0(1, 5) = beta(4) * beta(7);
    m_T0(2, 5) = beta(3) * beta(7) + beta(4) * beta(6);
    m_T0(3, 5) = beta(5) * beta(8);
    m_T0(4, 5) = beta(3) * beta(8) + beta(6) * beta(5);
    m_T0(5, 5) = beta(4) * beta(8) + beta(5) * beta(7);
}